

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

void __thiscall
Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::RefCntWeakPtr
          (RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *this,
          ShaderResourceBindingVkImpl *pObj)

{
  IReferenceCounters *Ptr;
  RefCountersImpl *pRVar1;
  ShaderResourceBindingVkImpl *pObj_local;
  RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *this_local;
  
  this->m_pRefCounters = (RefCountersImpl *)0x0;
  this->m_pObject = pObj;
  if (this->m_pObject != (ShaderResourceBindingVkImpl *)0x0) {
    Ptr = RefCountedObject<Diligent::IShaderResourceBindingVk>::GetReferenceCounters
                    ((RefCountedObject<Diligent::IShaderResourceBindingVk> *)this->m_pObject);
    pRVar1 = ClassPtrCast<Diligent::RefCountersImpl,Diligent::IReferenceCounters>(Ptr);
    this->m_pRefCounters = pRVar1;
    RefCountersImpl::AddWeakRef(this->m_pRefCounters);
  }
  return;
}

Assistant:

explicit RefCntWeakPtr(T* pObj) noexcept :
        m_pRefCounters{nullptr},
        m_pObject{pObj}
    {
        if (m_pObject)
        {
            m_pRefCounters = ClassPtrCast<RefCountersImpl>(m_pObject->GetReferenceCounters());
            m_pRefCounters->AddWeakRef();
        }
    }